

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_sum_rows(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  float local_b4;
  size_t local_b0;
  size_t local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  size_t local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  size_t local_50;
  size_t local_48;
  int64_t local_40;
  long local_38;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x7df,"fatal error");
  }
  if (params->ith == 0) {
    if (pgVar1->nb[0] == 4) {
      if (dst->nb[0] == 4) {
        if (dst->ne[0] == 1) {
          local_68 = pgVar1->ne[1];
          if (dst->ne[1] == local_68) {
            local_70 = pgVar1->ne[2];
            if (dst->ne[2] == local_70) {
              local_a0 = pgVar1->ne[3];
              if (dst->ne[3] == local_a0) {
                local_48 = pgVar1->nb[1];
                local_78 = pgVar1->nb[2];
                local_40 = pgVar1->ne[0];
                local_a8 = pgVar1->nb[3];
                local_50 = dst->nb[1];
                local_80 = dst->nb[2];
                local_b0 = dst->nb[3];
                local_68 = ~((long)local_68 >> 0x3f) & local_68;
                local_70 = ~((long)local_70 >> 0x3f) & local_70;
                local_38 = 0;
                local_a0 = ~((long)local_a0 >> 0x3f) & local_a0;
                lVar4 = 0;
                for (local_98 = 0; local_98 != local_a0; local_98 = local_98 + 1) {
                  local_90 = local_38;
                  local_88 = lVar4;
                  for (uVar3 = 0; uVar7 = local_68, local_60 = local_38, local_58 = lVar4,
                      uVar3 != local_70; uVar3 = uVar3 + 1) {
                    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
                      pvVar2 = dst->data;
                      local_b4 = 0.0;
                      ggml_vec_sum_f32((int)local_40,&local_b4,(float *)((long)pgVar1->data + lVar4)
                                      );
                      lVar4 = lVar4 + local_48;
                      *(float *)((long)pvVar2 + local_38) = local_b4;
                      local_38 = local_38 + local_50;
                    }
                    local_38 = local_60 + local_80;
                    lVar4 = local_58 + local_78;
                  }
                  local_38 = local_90 + local_b0;
                  lVar4 = local_88 + local_a8;
                }
                return;
              }
              pcVar5 = "ne3 == ne03";
              uVar6 = 0x7c3;
            }
            else {
              pcVar5 = "ne2 == ne02";
              uVar6 = 0x7c2;
            }
          }
          else {
            pcVar5 = "ne1 == ne01";
            uVar6 = 0x7c1;
          }
        }
        else {
          pcVar5 = "ne0 == 1";
          uVar6 = 0x7c0;
        }
      }
      else {
        pcVar5 = "dst->nb[0] == sizeof(float)";
        uVar6 = 0x7bc;
      }
    }
    else {
      pcVar5 = "src0->nb[0] == sizeof(float)";
      uVar6 = 0x7bb;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar6,"GGML_ASSERT(%s) failed",pcVar5);
  }
  return;
}

Assistant:

void ggml_compute_forward_sum_rows(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_sum_rows_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}